

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::renderBuffers(SceneRender *this,Uniforms *_uniforms)

{
  pointer *pppFVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  iterator __position;
  Camera *_camera;
  Shader *pSVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint uVar27;
  uint uVar28;
  Fbo *pFVar29;
  pointer ppFVar30;
  long *plVar31;
  mapped_type *ppSVar32;
  float *pfVar33;
  _Base_ptr p_Var34;
  pointer ppFVar35;
  size_type *psVar36;
  ulong uVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  string bufferName;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 uStack_e0;
  long local_d8;
  undefined8 uStack_d0;
  size_type local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  unsigned_long local_a8;
  Tracker *local_a0;
  key_type local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  vector<vera::Fbo*,std::allocator<vera::Fbo*>> *local_58;
  _Base_ptr local_50;
  Model *local_48;
  ShaderMap *local_40;
  mat4 *local_38;
  
  local_58 = (vector<vera::Fbo*,std::allocator<vera::Fbo*>> *)&this->buffersFbo;
  ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar35 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (this->m_buffers_total != (long)ppFVar35 - (long)ppFVar30 >> 3) {
    if (ppFVar35 != ppFVar30) {
      uVar37 = 0;
      do {
        if (ppFVar30[uVar37] != (Fbo *)0x0) {
          (*ppFVar30[uVar37]->_vptr_Fbo[1])();
          ppFVar30 = (this->buffersFbo).
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppFVar35 = (this->buffersFbo).
                     super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        uVar37 = uVar37 + 1;
      } while (uVar37 < (ulong)((long)ppFVar35 - (long)ppFVar30 >> 3));
    }
    if (ppFVar35 != ppFVar30) {
      (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppFVar30;
      ppFVar35 = ppFVar30;
    }
    if (this->m_buffers_total != 0) {
      uVar37 = 0;
      do {
        pFVar29 = (Fbo *)operator_new(0x38);
        vera::Fbo::Fbo(pFVar29);
        __position._M_current =
             (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_188 = (undefined1  [8])pFVar29;
        if (__position._M_current ==
            (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::Fbo*,std::allocator<vera::Fbo*>>::_M_realloc_insert<vera::Fbo*>
                    (local_58,__position,(Fbo **)local_188);
        }
        else {
          *__position._M_current = pFVar29;
          pppFVar1 = &(this->buffersFbo).
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        pFVar29 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar37];
        uVar27 = vera::getWindowWidth();
        uVar28 = vera::getWindowHeight();
        (*pFVar29->_vptr_Fbo[2])(pFVar29,(ulong)uVar27,(ulong)uVar28,4,0,0,1);
        uVar37 = uVar37 + 1;
      } while (uVar37 < this->m_buffers_total);
      ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppFVar35 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  local_a8 = 0;
  if (ppFVar35 != ppFVar30) {
    local_38 = &(this->m_origin).m_transformMatrix;
    local_48 = &this->m_floor;
    local_40 = &(this->m_floor).gBuffersShaders;
    local_a0 = &_uniforms->tracker;
    local_50 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pFVar29 = ppFVar30[local_a8];
      if (pFVar29->m_allocated == false) {
        uVar27 = vera::getWindowWidth();
        uVar28 = vera::getWindowHeight();
        (*pFVar29->_vptr_Fbo[2])(pFVar29,(ulong)uVar27,(ulong)uVar28,4,0,0,1);
      }
      paVar38 = &local_148.field_2;
      (**(code **)(**(long **)(*(long *)local_58 + local_a8 * 8) + 0x18))();
      vera::toString<unsigned_long>((string *)local_188,&local_a8);
      plVar31 = (long *)std::__cxx11::string::replace((ulong)local_188,0,(char *)0x0,0x2dfd9d);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      psVar36 = (size_type *)(plVar31 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar31 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar36) {
        local_98.field_2._M_allocated_capacity = *psVar36;
        local_98.field_2._8_8_ = plVar31[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar36;
        local_98._M_dataplus._M_p = (pointer)*plVar31;
      }
      local_98._M_string_length = plVar31[1];
      *plVar31 = (long)psVar36;
      plVar31[1] = 0;
      *(undefined1 *)(plVar31 + 2) = 0;
      if (local_188 != (undefined1  [8])local_178) {
        operator_delete((void *)local_188,(long)local_178 + 1);
      }
      if (this->m_depth_test == true) {
        glEnable(0xb71);
      }
      _camera = (_uniforms->super_Scene).activeCamera;
      if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
        vera::setCamera(_camera);
        vera::applyMatrix(local_38);
      }
      if (-1 < this->m_floor_subd_target) {
        ppSVar32 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                   ::operator[](local_40,&local_98);
        pSVar13 = *ppSVar32;
        if (pSVar13 != (Shader *)0x0) {
          if ((_uniforms->tracker).m_running == true) {
            std::operator+(&local_148,"render:",&local_98);
            plVar31 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_188 = (undefined1  [8])local_178;
            pFVar29 = (Fbo *)(plVar31 + 2);
            if ((Fbo *)*plVar31 == pFVar29) {
              local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
              _fStack_170 = plVar31[3];
            }
            else {
              local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
              local_188 = (undefined1  [8])*plVar31;
            }
            uStack_180 = plVar31[1];
            *plVar31 = (long)pFVar29;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            Tracker::begin(local_a0,(string *)local_188);
            if (local_188 != (undefined1  [8])local_178) {
              operator_delete((void *)local_188,(long)local_178 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar38) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
          vera::Shader::use(pSVar13);
          (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar13,0);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"u_modelViewProjectionMatrix","");
          vera::getProjectionViewWorldMatrix();
          fVar43 = SUB84(local_148._M_dataplus._M_p,0);
          fVar44 = (float)((ulong)local_148._M_dataplus._M_p >> 0x20);
          fVar47 = (float)local_148._M_string_length;
          fVar48 = (float)(local_148._M_string_length >> 0x20);
          local_c8 = local_148._M_string_length;
          uStack_c0 = 0;
          fVar49 = (float)local_148.field_2._8_8_;
          fVar50 = (float)((ulong)local_148.field_2._8_8_ >> 0x20);
          local_d8 = local_148.field_2._8_8_;
          uStack_d0 = 0;
          fVar39 = (float)local_128;
          fVar40 = (float)((ulong)local_128 >> 0x20);
          local_b8 = local_128;
          uStack_b0 = 0;
          fVar53 = (float)local_120;
          fVar54 = (float)((ulong)local_120 >> 0x20);
          local_68 = local_120;
          uStack_60 = 0;
          fVar41 = (float)local_118;
          fVar42 = (float)((ulong)local_118 >> 0x20);
          fVar51 = (float)local_110;
          fVar52 = (float)((ulong)local_110 >> 0x20);
          local_78 = local_110;
          uStack_70 = 0;
          fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
          fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
          fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
          fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
          fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
          fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
          local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_148._M_dataplus._M_p;
          uStack_e0 = 0;
          fVar45 = (float)local_148.field_2._M_allocated_capacity;
          fVar46 = (float)((ulong)local_148.field_2._0_8_ >> 0x20);
          fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
          fVar18 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
          fVar19 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
          fVar20 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
          fVar21 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
          fVar22 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
          fVar23 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
          fVar24 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
          fVar25 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
          fVar26 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
          local_188._4_4_ = fVar42 * fVar14 + fVar40 * fVar4 + fVar46 * fVar3 + fVar44 * fVar2;
          local_188._0_4_ = fVar41 * fVar14 + fVar39 * fVar4 + fVar45 * fVar3 + fVar43 * fVar2;
          uStack_180 = CONCAT44(fVar14 * fVar52 + fVar4 * fVar54 + fVar3 * fVar50 + fVar2 * fVar48,
                                fVar14 * fVar51 + fVar4 * fVar53 + fVar3 * fVar49 + fVar2 * fVar47);
          local_178._4_4_ = fVar42 * fVar18 + fVar40 * fVar17 + fVar46 * fVar16 + fVar44 * fVar15;
          local_178._0_4_ = fVar41 * fVar18 + fVar39 * fVar17 + fVar45 * fVar16 + fVar43 * fVar15;
          fStack_16c = fVar18 * fVar52 + fVar17 * fVar54 + fVar16 * fVar50 + fVar15 * fVar48;
          fStack_170 = fVar18 * fVar51 + fVar17 * fVar53 + fVar16 * fVar49 + fVar15 * fVar47;
          local_168 = fVar41 * fVar22 + fVar39 * fVar21 + fVar45 * fVar20 + fVar43 * fVar19;
          fStack_164 = fVar42 * fVar22 + fVar40 * fVar21 + fVar46 * fVar20 + fVar44 * fVar19;
          fStack_160 = fVar22 * fVar51 + fVar21 * fVar53 + fVar20 * fVar49 + fVar19 * fVar47;
          fStack_15c = fVar22 * fVar52 + fVar21 * fVar54 + fVar20 * fVar50 + fVar19 * fVar48;
          local_158 = fVar41 * fVar26 + fVar39 * fVar25 + fVar45 * fVar24 + fVar43 * fVar23;
          fStack_154 = fVar42 * fVar26 + fVar40 * fVar25 + fVar46 * fVar24 + fVar44 * fVar23;
          fStack_150 = fVar26 * fVar51 + fVar25 * fVar53 + fVar24 * fVar49 + fVar23 * fVar47;
          fStack_14c = fVar26 * fVar52 + fVar25 * fVar54 + fVar24 * fVar50 + fVar23 * fVar48;
          vera::Shader::setUniform(pSVar13,&local_108,(mat4 *)local_188,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          local_188 = (undefined1  [8])local_178;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"u_model","");
          vera::Shader::setUniform
                    (pSVar13,(string *)local_188,
                     (this->m_origin).m_position.field_0.x +
                     (this->m_floor).super_Node.m_position.field_0.x,
                     (this->m_origin).m_position.field_1.y +
                     (this->m_floor).super_Node.m_position.field_1.y,
                     (this->m_origin).m_position.field_2.z +
                     (this->m_floor).super_Node.m_position.field_2.z);
          if (local_188 != (undefined1  [8])local_178) {
            operator_delete((void *)local_188,(long)local_178 + 1);
          }
          local_148._M_dataplus._M_p = (pointer)paVar38;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_modelMatrix","");
          local_e8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
          local_e8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
          local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
          local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
          uStack_c0 = 0;
          uVar5 = (this->m_origin).m_transformMatrix.value[1].field_0;
          uVar9 = (this->m_origin).m_transformMatrix.value[1].field_1;
          local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
          local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
          uStack_d0 = 0;
          local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
          local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
          uStack_b0 = 0;
          local_68._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
          local_68._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
          uStack_60 = 0;
          uVar6 = (this->m_origin).m_transformMatrix.value[3].field_0;
          uVar10 = (this->m_origin).m_transformMatrix.value[3].field_1;
          local_78._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
          local_78._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
          uStack_70 = 0;
          fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
          fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
          fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
          fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
          fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
          fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
          uStack_e0 = 0;
          fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
          fVar18 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
          fVar19 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
          fVar20 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
          fVar21 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
          fVar22 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
          fVar23 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
          fVar24 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
          fVar25 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
          fVar26 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
          local_188._4_4_ =
               (float)uVar10 * fVar14 +
               (float)local_b8._4_4_ * fVar4 + (float)uVar9 * fVar3 + (float)local_e8._4_4_ * fVar2;
          local_188._0_4_ =
               (float)uVar6 * fVar14 +
               (float)(undefined4)local_b8 * fVar4 +
               (float)uVar5 * fVar3 + (float)local_e8._0_4_ * fVar2;
          uStack_180 = CONCAT44(fVar14 * (float)local_78._4_4_ +
                                fVar4 * (float)local_68._4_4_ +
                                fVar3 * (float)local_d8._4_4_ + fVar2 * (float)local_c8._4_4_,
                                fVar14 * (float)(undefined4)local_78 +
                                fVar4 * (float)(undefined4)local_68 +
                                fVar3 * (float)(undefined4)local_d8 +
                                fVar2 * (float)(undefined4)local_c8);
          local_178._4_4_ =
               (float)uVar10 * fVar18 +
               (float)local_b8._4_4_ * fVar17 +
               (float)uVar9 * fVar16 + (float)local_e8._4_4_ * fVar15;
          local_178._0_4_ =
               (float)uVar6 * fVar18 +
               (float)(undefined4)local_b8 * fVar17 +
               (float)uVar5 * fVar16 + (float)local_e8._0_4_ * fVar15;
          fStack_16c = fVar18 * (float)local_78._4_4_ +
                       fVar17 * (float)local_68._4_4_ +
                       fVar16 * (float)local_d8._4_4_ + fVar15 * (float)local_c8._4_4_;
          fStack_170 = fVar18 * (float)(undefined4)local_78 +
                       fVar17 * (float)(undefined4)local_68 +
                       fVar16 * (float)(undefined4)local_d8 + fVar15 * (float)(undefined4)local_c8;
          local_168 = (float)uVar6 * fVar22 +
                      (float)(undefined4)local_b8 * fVar21 +
                      (float)uVar5 * fVar20 + (float)local_e8._0_4_ * fVar19;
          fStack_164 = (float)uVar10 * fVar22 +
                       (float)local_b8._4_4_ * fVar21 +
                       (float)uVar9 * fVar20 + (float)local_e8._4_4_ * fVar19;
          fStack_160 = fVar22 * (float)(undefined4)local_78 +
                       fVar21 * (float)(undefined4)local_68 +
                       fVar20 * (float)(undefined4)local_d8 + fVar19 * (float)(undefined4)local_c8;
          fStack_15c = fVar22 * (float)local_78._4_4_ +
                       fVar21 * (float)local_68._4_4_ +
                       fVar20 * (float)local_d8._4_4_ + fVar19 * (float)local_c8._4_4_;
          local_158 = (float)uVar6 * fVar26 +
                      (float)(undefined4)local_b8 * fVar25 +
                      (float)uVar5 * fVar24 + (float)local_e8._0_4_ * fVar23;
          fStack_154 = (float)uVar10 * fVar26 +
                       (float)local_b8._4_4_ * fVar25 +
                       (float)uVar9 * fVar24 + (float)local_e8._4_4_ * fVar23;
          fStack_150 = fVar26 * (float)(undefined4)local_78 +
                       fVar25 * (float)(undefined4)local_68 +
                       fVar24 * (float)(undefined4)local_d8 + fVar23 * (float)(undefined4)local_c8;
          fStack_14c = fVar26 * (float)local_78._4_4_ +
                       fVar25 * (float)local_68._4_4_ +
                       fVar24 * (float)local_d8._4_4_ + fVar23 * (float)local_c8._4_4_;
          vera::Shader::setUniform(pSVar13,&local_148,(mat4 *)local_188,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar38) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          vera::Model::render(local_48,pSVar13);
          if ((_uniforms->tracker).m_running == true) {
            std::operator+(&local_148,"render:",&local_98);
            plVar31 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_188 = (undefined1  [8])local_178;
            pFVar29 = (Fbo *)(plVar31 + 2);
            if ((Fbo *)*plVar31 == pFVar29) {
              local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
              _fStack_170 = plVar31[3];
            }
            else {
              local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
              local_188 = (undefined1  [8])*plVar31;
            }
            uStack_180 = plVar31[1];
            *plVar31 = (long)pFVar29;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            Tracker::end(local_a0,(string *)local_188);
            if (local_188 != (undefined1  [8])local_178) {
              operator_delete((void *)local_188,(long)local_178 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar38) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      vera::cullingMode(this->m_culling);
      p_Var34 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      if (p_Var34 != local_50) {
        do {
          ppSVar32 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                   *)(*(long *)(p_Var34 + 2) + 600),&local_98);
          pSVar13 = *ppSVar32;
          if (pSVar13 != (Shader *)0x0) {
            if ((_uniforms->tracker).m_running == true) {
              std::operator+(&local_108,"render:",&local_98);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_108);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              psVar36 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar36) {
                local_148.field_2._M_allocated_capacity = *psVar36;
                local_148.field_2._8_8_ = plVar31[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *psVar36;
                local_148._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_148._M_string_length = plVar31[1];
              *plVar31 = (long)psVar36;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              plVar31 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_148,
                                           *(ulong *)(*(long *)(p_Var34 + 2) + 0x2b0));
              local_188 = (undefined1  [8])local_178;
              pFVar29 = (Fbo *)(plVar31 + 2);
              if ((Fbo *)*plVar31 == pFVar29) {
                local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
                _fStack_170 = plVar31[3];
              }
              else {
                local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
                local_188 = (undefined1  [8])*plVar31;
              }
              uStack_180 = plVar31[1];
              *plVar31 = (long)pFVar29;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              Tracker::begin(local_a0,(string *)local_188);
              if (local_188 != (undefined1  [8])local_178) {
                operator_delete((void *)local_188,(long)local_178 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
            }
            vera::Shader::use(pSVar13);
            (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar13,0);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"u_modelViewProjectionMatrix","");
            vera::getProjectionViewWorldMatrix();
            pfVar33 = (float *)(**(code **)(**(long **)(p_Var34 + 2) + 0x100))();
            fVar43 = SUB84(local_148._M_dataplus._M_p,0);
            fVar44 = (float)((ulong)local_148._M_dataplus._M_p >> 0x20);
            fVar47 = (float)local_148._M_string_length;
            fVar48 = (float)(local_148._M_string_length >> 0x20);
            local_c8 = local_148._M_string_length;
            uStack_c0 = 0;
            fVar49 = (float)local_148.field_2._8_8_;
            fVar50 = (float)((ulong)local_148.field_2._8_8_ >> 0x20);
            local_d8 = local_148.field_2._8_8_;
            uStack_d0 = 0;
            fVar39 = (float)local_128;
            fVar40 = (float)((ulong)local_128 >> 0x20);
            local_b8 = local_128;
            uStack_b0 = 0;
            fVar53 = (float)local_120;
            fVar54 = (float)((ulong)local_120 >> 0x20);
            local_68 = local_120;
            uStack_60 = 0;
            fVar41 = (float)local_118;
            fVar42 = (float)((ulong)local_118 >> 0x20);
            fVar51 = (float)local_110;
            fVar52 = (float)((ulong)local_110 >> 0x20);
            local_78 = local_110;
            uStack_70 = 0;
            fVar14 = *pfVar33;
            fVar15 = pfVar33[1];
            fVar16 = pfVar33[2];
            fVar17 = pfVar33[3];
            fVar18 = pfVar33[4];
            fVar19 = pfVar33[5];
            local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_148._M_dataplus._M_p;
            uStack_e0 = 0;
            fVar45 = (float)local_148.field_2._M_allocated_capacity;
            fVar46 = (float)((ulong)local_148.field_2._0_8_ >> 0x20);
            fVar20 = pfVar33[6];
            fVar21 = pfVar33[7];
            fVar22 = pfVar33[8];
            fVar23 = pfVar33[9];
            fVar24 = pfVar33[10];
            fVar25 = pfVar33[0xb];
            fVar26 = pfVar33[0xc];
            fVar2 = pfVar33[0xd];
            fVar3 = pfVar33[0xe];
            fVar4 = pfVar33[0xf];
            local_188._4_4_ = fVar42 * fVar17 + fVar40 * fVar16 + fVar46 * fVar15 + fVar44 * fVar14;
            local_188._0_4_ = fVar41 * fVar17 + fVar39 * fVar16 + fVar45 * fVar15 + fVar43 * fVar14;
            uStack_180 = CONCAT44(fVar17 * fVar52 +
                                  fVar16 * fVar54 + fVar15 * fVar50 + fVar14 * fVar48,
                                  fVar17 * fVar51 +
                                  fVar16 * fVar53 + fVar15 * fVar49 + fVar14 * fVar47);
            local_178._4_4_ = fVar42 * fVar21 + fVar40 * fVar20 + fVar46 * fVar19 + fVar44 * fVar18;
            local_178._0_4_ = fVar41 * fVar21 + fVar39 * fVar20 + fVar45 * fVar19 + fVar43 * fVar18;
            fStack_16c = fVar21 * fVar52 + fVar20 * fVar54 + fVar19 * fVar50 + fVar18 * fVar48;
            fStack_170 = fVar21 * fVar51 + fVar20 * fVar53 + fVar19 * fVar49 + fVar18 * fVar47;
            local_168 = fVar41 * fVar25 + fVar39 * fVar24 + fVar45 * fVar23 + fVar43 * fVar22;
            fStack_164 = fVar42 * fVar25 + fVar40 * fVar24 + fVar46 * fVar23 + fVar44 * fVar22;
            fStack_160 = fVar25 * fVar51 + fVar24 * fVar53 + fVar23 * fVar49 + fVar22 * fVar47;
            fStack_15c = fVar25 * fVar52 + fVar24 * fVar54 + fVar23 * fVar50 + fVar22 * fVar48;
            local_158 = fVar41 * fVar4 + fVar39 * fVar3 + fVar45 * fVar2 + fVar43 * fVar26;
            fStack_154 = fVar42 * fVar4 + fVar40 * fVar3 + fVar46 * fVar2 + fVar44 * fVar26;
            fStack_150 = fVar4 * fVar51 + fVar3 * fVar53 + fVar2 * fVar49 + fVar26 * fVar47;
            fStack_14c = fVar4 * fVar52 + fVar3 * fVar54 + fVar2 * fVar50 + fVar26 * fVar48;
            vera::Shader::setUniform(pSVar13,&local_108,(mat4 *)local_188,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            local_188 = (undefined1  [8])local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"u_model","");
            pfVar33 = (float *)(**(code **)(**(long **)(p_Var34 + 2) + 0x98))();
            vera::Shader::setUniform
                      (pSVar13,(string *)local_188,(this->m_origin).m_position.field_0.x + *pfVar33,
                       (this->m_origin).m_position.field_1.y + pfVar33[1],
                       (this->m_origin).m_position.field_2.z + pfVar33[2]);
            if (local_188 != (undefined1  [8])local_178) {
              operator_delete((void *)local_188,(long)local_178 + 1);
            }
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_modelMatrix","")
            ;
            pfVar33 = (float *)(**(code **)(**(long **)(p_Var34 + 2) + 0x100))();
            local_e8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
            local_e8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
            local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
            local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
            uStack_c0 = 0;
            uVar7 = (this->m_origin).m_transformMatrix.value[1].field_0;
            uVar11 = (this->m_origin).m_transformMatrix.value[1].field_1;
            local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
            local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
            uStack_d0 = 0;
            local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
            local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
            uStack_b0 = 0;
            local_68._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
            local_68._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
            uStack_60 = 0;
            uVar8 = (this->m_origin).m_transformMatrix.value[3].field_0;
            uVar12 = (this->m_origin).m_transformMatrix.value[3].field_1;
            local_78._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
            local_78._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
            uStack_70 = 0;
            fVar14 = *pfVar33;
            fVar15 = pfVar33[1];
            fVar16 = pfVar33[2];
            fVar17 = pfVar33[3];
            fVar18 = pfVar33[4];
            fVar19 = pfVar33[5];
            uStack_e0 = 0;
            fVar20 = pfVar33[6];
            fVar21 = pfVar33[7];
            fVar22 = pfVar33[8];
            fVar23 = pfVar33[9];
            fVar24 = pfVar33[10];
            fVar25 = pfVar33[0xb];
            fVar26 = pfVar33[0xc];
            fVar2 = pfVar33[0xd];
            fVar3 = pfVar33[0xe];
            fVar4 = pfVar33[0xf];
            local_188._4_4_ =
                 (float)uVar12 * fVar17 +
                 (float)local_b8._4_4_ * fVar16 +
                 (float)uVar11 * fVar15 + (float)local_e8._4_4_ * fVar14;
            local_188._0_4_ =
                 (float)uVar8 * fVar17 +
                 (float)(undefined4)local_b8 * fVar16 +
                 (float)uVar7 * fVar15 + (float)local_e8._0_4_ * fVar14;
            uStack_180 = CONCAT44(fVar17 * (float)local_78._4_4_ +
                                  fVar16 * (float)local_68._4_4_ +
                                  fVar15 * (float)local_d8._4_4_ + fVar14 * (float)local_c8._4_4_,
                                  fVar17 * (float)(undefined4)local_78 +
                                  fVar16 * (float)(undefined4)local_68 +
                                  fVar15 * (float)(undefined4)local_d8 +
                                  fVar14 * (float)(undefined4)local_c8);
            local_178._4_4_ =
                 (float)uVar12 * fVar21 +
                 (float)local_b8._4_4_ * fVar20 +
                 (float)uVar11 * fVar19 + (float)local_e8._4_4_ * fVar18;
            local_178._0_4_ =
                 (float)uVar8 * fVar21 +
                 (float)(undefined4)local_b8 * fVar20 +
                 (float)uVar7 * fVar19 + (float)local_e8._0_4_ * fVar18;
            fStack_16c = fVar21 * (float)local_78._4_4_ +
                         fVar20 * (float)local_68._4_4_ +
                         fVar19 * (float)local_d8._4_4_ + fVar18 * (float)local_c8._4_4_;
            fStack_170 = fVar21 * (float)(undefined4)local_78 +
                         fVar20 * (float)(undefined4)local_68 +
                         fVar19 * (float)(undefined4)local_d8 + fVar18 * (float)(undefined4)local_c8
            ;
            local_168 = (float)uVar8 * fVar25 +
                        (float)(undefined4)local_b8 * fVar24 +
                        (float)uVar7 * fVar23 + (float)local_e8._0_4_ * fVar22;
            fStack_164 = (float)uVar12 * fVar25 +
                         (float)local_b8._4_4_ * fVar24 +
                         (float)uVar11 * fVar23 + (float)local_e8._4_4_ * fVar22;
            fStack_160 = fVar25 * (float)(undefined4)local_78 +
                         fVar24 * (float)(undefined4)local_68 +
                         fVar23 * (float)(undefined4)local_d8 + fVar22 * (float)(undefined4)local_c8
            ;
            fStack_15c = fVar25 * (float)local_78._4_4_ +
                         fVar24 * (float)local_68._4_4_ +
                         fVar23 * (float)local_d8._4_4_ + fVar22 * (float)local_c8._4_4_;
            local_158 = (float)uVar8 * fVar4 +
                        (float)(undefined4)local_b8 * fVar3 +
                        (float)uVar7 * fVar2 + (float)local_e8._0_4_ * fVar26;
            fStack_154 = (float)uVar12 * fVar4 +
                         (float)local_b8._4_4_ * fVar3 +
                         (float)uVar11 * fVar2 + (float)local_e8._4_4_ * fVar26;
            fStack_150 = fVar4 * (float)(undefined4)local_78 +
                         fVar3 * (float)(undefined4)local_68 +
                         fVar2 * (float)(undefined4)local_d8 + fVar26 * (float)(undefined4)local_c8;
            fStack_14c = fVar4 * (float)local_78._4_4_ +
                         fVar3 * (float)local_68._4_4_ +
                         fVar2 * (float)local_d8._4_4_ + fVar26 * (float)local_c8._4_4_;
            vera::Shader::setUniform(pSVar13,&local_148,(mat4 *)local_188,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            vera::Model::render(*(Model **)(p_Var34 + 2),pSVar13);
            if ((_uniforms->tracker).m_running == true) {
              std::operator+(&local_108,"render:",&local_98);
              plVar31 = (long *)std::__cxx11::string::append((char *)&local_108);
              psVar36 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar36) {
                local_148.field_2._M_allocated_capacity = *psVar36;
                local_148.field_2._8_8_ = plVar31[3];
                local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              }
              else {
                local_148.field_2._M_allocated_capacity = *psVar36;
                local_148._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_148._M_string_length = plVar31[1];
              *plVar31 = (long)psVar36;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              plVar31 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_148,
                                           *(ulong *)(*(long *)(p_Var34 + 2) + 0x2b0));
              local_188 = (undefined1  [8])local_178;
              pFVar29 = (Fbo *)(plVar31 + 2);
              if ((Fbo *)*plVar31 == pFVar29) {
                local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
                _fStack_170 = plVar31[3];
              }
              else {
                local_178 = (undefined1  [8])pFVar29->_vptr_Fbo;
                local_188 = (undefined1  [8])*plVar31;
              }
              uStack_180 = plVar31[1];
              *plVar31 = (long)pFVar29;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              Tracker::end(local_a0,(string *)local_188);
              if (local_188 != (undefined1  [8])local_178) {
                operator_delete((void *)local_188,(long)local_178 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
            }
          }
          p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34);
        } while (p_Var34 != local_50);
      }
      if (this->m_depth_test != false) {
        glDisable(0xb71);
      }
      if (this->m_culling != CULL_NONE) {
        glDisable(0xb44);
      }
      (**(code **)(**(long **)(*(long *)local_58 + local_a8 * 8) + 0x20))();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      local_a8 = local_a8 + 1;
      ppFVar30 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (local_a8 <
             (ulong)((long)(this->buffersFbo).
                           super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppFVar30 >> 3));
  }
  return;
}

Assistant:

void SceneRender::renderBuffers(Uniforms& _uniforms) {
    if ( m_buffers_total != buffersFbo.size() ) {
        for (size_t i = 0; i < buffersFbo.size(); i++)
            delete buffersFbo[i];
        buffersFbo.clear();
        
        for (size_t i = 0; i < m_buffers_total; i++) {
            buffersFbo.push_back( new vera::Fbo() );

            // glm::vec2 size = glm::vec2(vera::getWindowWidth(), vera::getWindowHeight());
            // buffersFbo[i].fixed = getBufferSize(_fragmentShader, "u_sceneBuffer" + vera::toString(i), size);
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
        }
    }

    vera::Shader* bufferShader = nullptr;
    for (size_t i = 0; i < buffersFbo.size(); i++) {
        if (!buffersFbo[i]->isAllocated())
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
            // continue;;

        buffersFbo[i]->bind();
        std::string bufferName = "u_sceneBuffer" + vera::toString(i);

        // Begining of DEPTH for 3D 
        if (m_depth_test)
            glEnable(GL_DEPTH_TEST);

        if (_uniforms.activeCamera->bChange || m_origin.bChange) {
            vera::setCamera( _uniforms.activeCamera );
            vera::applyMatrix( m_origin.getTransformMatrix() );
        }

        if (m_floor_subd_target >= 0) {
            bufferShader = m_floor.getBufferShader(bufferName);
            if (bufferShader != nullptr) {
                    TRACK_BEGIN("render:"+bufferName+":floor")
                    bufferShader->use();
                    _uniforms.feedTo( bufferShader, false );
                    bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix() );
                    bufferShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                    bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                    m_floor.render(bufferShader);
                    TRACK_END("render:"+bufferName+":floor")
                }
        }

        vera::cullingMode(m_culling);

        for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
            bufferShader = it->second->getBufferShader(bufferName);

            if (bufferShader != nullptr) {
                TRACK_BEGIN("render:" + bufferName + ":" + it->second->getName())

                // bind the shader
                bufferShader->use();

                // Update Uniforms and textures variables to the shader
                _uniforms.feedTo( bufferShader, false );

                // Pass special uniforms
                bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
                bufferShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
                bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
                it->second->render(bufferShader);

                TRACK_END("render:" + bufferName + ":" + it->second->getName())
            }
        }

        if (m_depth_test)
            glDisable(GL_DEPTH_TEST);

        if (m_culling != 0)
            glDisable(GL_CULL_FACE);

        buffersFbo[i]->unbind();
    }
}